

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O3

_Bool DUI_CheckboxAt(int x,int y,char *text,_Bool *checked)

{
  SDL_Point SVar1;
  _Bool _Var2;
  
  SVar1 = _duiCursor;
  _duiCursor.y = y;
  _duiCursor.x = x;
  _duiLineStart = x;
  _Var2 = DUI_Checkbox(text,checked);
  _duiCursor = SVar1;
  _duiLineStart = SVar1.x;
  return _Var2;
}

Assistant:

void DUI_MoveCursor(int x, int y)
{
    _duiCursor.x = x;
    _duiCursor.y = y;
    _duiLineStart = _duiCursor.x;
}